

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::RowSingletonPS::RowSingletonPS
          (RowSingletonPS *this,SPxLPBase<double> *lp,int _i,int _j,bool strictLo,bool strictUp,
          double newLo,double newUp,double oldLo,double oldUp,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  SPxSense SVar2;
  double *pdVar3;
  double *pdVar4;
  SPxLPBase<double> *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  SPxLPBase<double> *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  byte in_R9B;
  undefined8 in_XMM0_Qa;
  double dVar5;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  SPxLPBase<double> *in_stack_ffffffffffffff30;
  SPxLPBase<double> *this_01;
  undefined8 in_stack_ffffffffffffff38;
  int i;
  SPxLPBase<double> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  PostStep *in_stack_ffffffffffffff50;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff30,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2bbd75);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2bbd88);
  PostStep::PostStep(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff40,
                     (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38)
  ;
  i = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2bbdbf);
  *in_RDI = &PTR__RowSingletonPS_004ecc48;
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2bbdf2);
  *(int *)((long)in_RDI + 0x2c) = iVar1 + -1;
  *(undefined4 *)(in_RDI + 6) = in_ECX;
  pdVar3 = SPxLPBase<double>::lhs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  in_RDI[7] = *pdVar3;
  pdVar3 = (double *)(in_RDI + 8);
  pdVar4 = SPxLPBase<double>::rhs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  *pdVar3 = *pdVar4;
  *(byte *)(in_RDI + 9) = in_R8B & 1;
  *(byte *)((long)in_RDI + 0x49) = in_R9B & 1;
  SVar2 = SPxLPBase<double>::spxSense(in_RSI);
  *(bool *)((long)in_RDI + 0x4a) = SVar2 == MAXIMIZE;
  pdVar3 = (double *)(in_RDI + 10);
  SVar2 = SPxLPBase<double>::spxSense(in_RSI);
  if (SVar2 == MINIMIZE) {
    dVar5 = SPxLPBase<double>::obj(in_stack_ffffffffffffff40,i);
  }
  else {
    dVar5 = SPxLPBase<double>::obj(in_stack_ffffffffffffff40,i);
    dVar5 = -dVar5;
  }
  *pdVar3 = dVar5;
  this_01 = (SPxLPBase<double> *)(in_RDI + 0xb);
  this_00 = (SPxLPBase<double> *)SPxLPBase<double>::colVector(this_01,in_stack_ffffffffffffff2c);
  DSVectorBase<double>::DSVectorBase<double>
            ((DSVectorBase<double> *)this_01,
             (SVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  in_RDI[0xf] = in_XMM0_Qa;
  in_RDI[0x10] = in_XMM1_Qa;
  in_RDI[0x11] = in_XMM2_Qa;
  in_RDI[0x12] = in_XMM3_Qa;
  dVar5 = SPxLPBase<double>::rowObj(this_00,(int)((ulong)this_01 >> 0x20));
  in_RDI[0x13] = dVar5;
  return;
}

Assistant:

RowSingletonPS(const SPxLPBase<R>& lp, int _i, int _j, bool strictLo, bool strictUp,
                     R newLo, R newUp, R oldLo, R oldUp, std::shared_ptr<Tolerances> tols)
         : PostStep("RowSingleton", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_j(_j)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_strictLo(strictLo)
         , m_strictUp(strictUp)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_col(lp.colVector(_j))
         , m_newLo(newLo)
         , m_newUp(newUp)
         , m_oldLo(oldLo)
         , m_oldUp(oldUp)
         , m_row_obj(lp.rowObj(_i))
      {}